

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.h
# Opt level: O2

size_t __thiscall std::hash<PPData::Peptide>::operator()(hash<PPData::Peptide> *this,Peptide *p)

{
  size_t sVar1;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_31;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  __cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,p->sequence,p->sequence + p->sequence_length);
  sVar1 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
          operator()(&local_31,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return sVar1;
}

Assistant:

size_t operator()(const PPData::Peptide& p) const {
            return (hash<string>()(string(p.sequence, p.sequence_length)));
//            return CityHash32(p.sequence, p.sequence_length);
        }